

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O2

void plutovg_surface_clear(plutovg_surface_t *surface,plutovg_color_t *color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int y;
  int iVar6;
  
  uVar1 = plutovg_color_to_argb32(color);
  uVar5 = uVar1 >> 0x18;
  uVar3 = uVar1 >> 0x10 & 0xff;
  uVar2 = uVar1 >> 8 & 0xff;
  uVar4 = uVar1 & 0xff;
  if (uVar5 != 0xff) {
    uVar3 = (uVar3 * uVar5) / 0xff;
    uVar2 = (uVar2 * uVar5) / 0xff;
    uVar4 = (uVar4 * uVar5) / 0xff;
  }
  for (iVar6 = 0; iVar6 < surface->height; iVar6 = iVar6 + 1) {
    plutovg_memfill32((uint *)(surface->data + (long)iVar6 * (long)surface->stride),surface->width,
                      uVar2 << 8 | uVar4 | uVar3 << 0x10 | uVar1 & 0xff000000);
  }
  return;
}

Assistant:

void plutovg_surface_clear(plutovg_surface_t* surface, const plutovg_color_t* color)
{
    uint32_t pixel = plutovg_premultiply_argb(plutovg_color_to_argb32(color));
    for(int y = 0; y < surface->height; y++) {
        uint32_t* pixels = (uint32_t*)(surface->data + surface->stride * y);
        plutovg_memfill32(pixels, surface->width, pixel);
    }
}